

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_s2polygon_layer.cc
# Opt level: O0

void __thiscall
s2builderutil::S2PolygonLayer::AppendS2Loops
          (S2PolygonLayer *this,Graph *g,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *edge_loops,
          vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
          *loops)

{
  pointer this_00;
  bool bVar1;
  reference this_01;
  size_type __n;
  reference piVar2;
  Edge *pEVar3;
  S2Point *__x;
  S2Debug local_99;
  value_type local_98;
  EdgeId local_8c;
  const_iterator cStack_88;
  int edge_id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> *edge_loop;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__range1;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  *loops_local;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *edge_loops_local;
  Graph *g_local;
  S2PolygonLayer *this_local;
  
  vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)loops;
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&__range1);
  __end1 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::begin(edge_loops);
  edge_loop = (vector<int,_std::allocator<int>_> *)
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::end(edge_loops);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                *)&edge_loop);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator*(&__end1);
    __n = std::vector<int,_std::allocator<int>_>::size(this_01);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&__range1,__n);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(this_01);
    cStack_88 = std::vector<int,_std::allocator<int>_>::end(this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff78);
      this_00 = vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (!bVar1) break;
      piVar2 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_8c = *piVar2;
      pEVar3 = S2Builder::Graph::edge(g,local_8c);
      __x = S2Builder::Graph::vertex(g,pEVar3->first);
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::push_back
                ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&__range1,__x);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    local_99 = S2Polygon::s2debug_override(this->polygon_);
    absl::make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>&,S2Debug>
              ((absl *)&local_98,
               (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&__range1,&local_99);
    std::
    vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
    ::push_back((vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                 *)this_00,&local_98);
    std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::~unique_ptr(&local_98);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::clear
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&__range1);
    __gnu_cxx::
    __normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
            ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&__range1);
  return;
}

Assistant:

void S2PolygonLayer::AppendS2Loops(const Graph& g,
                                   const vector<Graph::EdgeLoop>& edge_loops,
                                   vector<unique_ptr<S2Loop>>* loops) const {
  vector<S2Point> vertices;
  for (const auto& edge_loop : edge_loops) {
    vertices.reserve(edge_loop.size());
    for (auto edge_id : edge_loop) {
      vertices.push_back(g.vertex(g.edge(edge_id).first));
    }
    loops->push_back(
        make_unique<S2Loop>(vertices, polygon_->s2debug_override()));
    vertices.clear();
  }
}